

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_ge(secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b)

{
  uint64_t *puVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  undefined1 auVar552 [16];
  undefined1 auVar553 [16];
  undefined1 auVar554 [16];
  undefined1 auVar555 [16];
  undefined1 auVar556 [16];
  undefined1 auVar557 [16];
  undefined1 auVar558 [16];
  undefined1 auVar559 [16];
  undefined1 auVar560 [16];
  undefined1 auVar561 [16];
  undefined1 auVar562 [16];
  undefined1 auVar563 [16];
  undefined1 auVar564 [16];
  undefined1 auVar565 [16];
  undefined1 auVar566 [16];
  undefined1 auVar567 [16];
  undefined1 auVar568 [16];
  undefined1 auVar569 [16];
  undefined1 auVar570 [16];
  undefined1 auVar571 [16];
  undefined1 auVar572 [16];
  undefined1 auVar573 [16];
  undefined1 auVar574 [16];
  undefined1 auVar575 [16];
  undefined1 auVar576 [16];
  undefined1 auVar577 [16];
  undefined1 auVar578 [16];
  undefined1 auVar579 [16];
  undefined1 auVar580 [16];
  undefined1 auVar581 [16];
  undefined1 auVar582 [16];
  undefined1 auVar583 [16];
  undefined1 auVar584 [16];
  undefined1 auVar585 [16];
  undefined1 auVar586 [16];
  undefined1 auVar587 [16];
  undefined1 auVar588 [16];
  undefined1 auVar589 [16];
  undefined1 auVar590 [16];
  undefined1 auVar591 [16];
  undefined1 auVar592 [16];
  undefined1 auVar593 [16];
  undefined1 auVar594 [16];
  undefined1 auVar595 [16];
  undefined1 auVar596 [16];
  undefined1 auVar597 [16];
  undefined1 auVar598 [16];
  undefined1 auVar599 [16];
  undefined1 auVar600 [16];
  undefined1 auVar601 [16];
  undefined1 auVar602 [16];
  undefined1 auVar603 [16];
  undefined1 auVar604 [16];
  undefined1 auVar605 [16];
  undefined1 auVar606 [16];
  undefined1 auVar607 [16];
  undefined1 auVar608 [16];
  undefined1 auVar609 [16];
  undefined1 auVar610 [16];
  undefined1 auVar611 [16];
  undefined1 auVar612 [16];
  undefined1 auVar613 [16];
  undefined1 auVar614 [16];
  undefined1 auVar615 [16];
  undefined1 auVar616 [16];
  undefined1 auVar617 [16];
  undefined1 auVar618 [16];
  undefined1 auVar619 [16];
  undefined1 auVar620 [16];
  undefined1 auVar621 [16];
  undefined1 auVar622 [16];
  undefined1 auVar623 [16];
  undefined1 auVar624 [16];
  undefined1 auVar625 [16];
  undefined1 auVar626 [16];
  undefined1 auVar627 [16];
  undefined1 auVar628 [16];
  undefined1 auVar629 [16];
  undefined1 auVar630 [16];
  undefined1 auVar631 [16];
  undefined1 auVar632 [16];
  undefined1 auVar633 [16];
  undefined1 auVar634 [16];
  undefined1 auVar635 [16];
  undefined1 auVar636 [16];
  undefined1 auVar637 [16];
  undefined1 auVar638 [16];
  undefined1 auVar639 [16];
  undefined1 auVar640 [16];
  undefined1 auVar641 [16];
  undefined1 auVar642 [16];
  undefined1 auVar643 [16];
  undefined1 auVar644 [16];
  undefined1 auVar645 [16];
  undefined1 auVar646 [16];
  undefined1 auVar647 [16];
  undefined1 auVar648 [16];
  undefined1 auVar649 [16];
  undefined1 auVar650 [16];
  undefined1 auVar651 [16];
  undefined1 auVar652 [16];
  undefined1 auVar653 [16];
  undefined1 auVar654 [16];
  undefined1 auVar655 [16];
  undefined1 auVar656 [16];
  undefined1 auVar657 [16];
  undefined1 auVar658 [16];
  undefined1 auVar659 [16];
  undefined1 auVar660 [16];
  undefined1 auVar661 [16];
  undefined1 auVar662 [16];
  uint uVar663;
  uint uVar664;
  int iVar665;
  uint64_t mask1;
  ulong uVar666;
  long lVar667;
  uint64_t mask0;
  ulong uVar668;
  ulong uVar669;
  ulong uVar670;
  ulong uVar671;
  ulong uVar672;
  ulong uVar673;
  ulong uVar674;
  ulong uVar675;
  ulong uVar676;
  ulong uVar677;
  ulong uVar678;
  secp256k1_fe *psVar679;
  ulong uVar680;
  ulong uVar681;
  ulong uVar682;
  ulong uVar683;
  ulong uVar684;
  ulong uVar685;
  ulong uVar686;
  ulong uVar687;
  uint64_t uVar688;
  uint64_t uVar693;
  undefined1 auVar689 [16];
  undefined1 auVar690 [16];
  undefined1 auVar691 [16];
  undefined1 auVar692 [16];
  ulong uVar694;
  ulong uVar695;
  ulong uVar696;
  uint64_t uVar697;
  ulong uVar699;
  ulong uVar700;
  ulong uVar701;
  uint64_t uVar702;
  undefined1 auVar698 [16];
  undefined1 auVar703 [16];
  ulong uVar704;
  ulong uVar706;
  undefined1 auVar705 [16];
  ulong uVar707;
  uint64_t tmp3_4;
  uint64_t tmp2_6;
  uint64_t tmp3_5;
  uint64_t tmp2_1;
  uint64_t tmp2_5;
  secp256k1_fe tt;
  secp256k1_fe u1;
  uint64_t tmp3_1;
  secp256k1_fe u2;
  secp256k1_fe q;
  secp256k1_fe s2;
  secp256k1_fe zz;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  secp256k1_fe local_180;
  ulong local_158;
  ulong uStack_150;
  ulong local_148;
  ulong uStack_140;
  ulong local_138;
  ulong local_128;
  ulong uStack_120;
  ulong local_118;
  ulong uStack_110;
  long local_108;
  ulong local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  ulong local_d8;
  ulong uStack_d0;
  ulong local_c8;
  ulong uStack_c0;
  long local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  secp256k1_fe local_58;
  
  psVar679 = &a->z;
  uVar675 = psVar679->n[0];
  uVar683 = (a->z).n[1];
  uVar670 = (a->z).n[2];
  uVar687 = (a->z).n[3];
  uVar671 = (a->z).n[4];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar675 * 2;
  auVar311._8_8_ = 0;
  auVar311._0_8_ = uVar687;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar683 * 2;
  auVar312._8_8_ = 0;
  auVar312._0_8_ = uVar670;
  auVar698._8_8_ = 0;
  auVar698._0_8_ = uVar671;
  auVar313._8_8_ = 0;
  auVar313._0_8_ = uVar671;
  uVar666 = SUB168(auVar698 * auVar313,0);
  auVar705._8_8_ = 0;
  auVar705._0_8_ = uVar666 & 0xfffffffffffff;
  auVar3 = auVar4 * auVar312 + auVar3 * auVar311 + auVar705 * ZEXT816(0x1000003d10);
  uVar673 = auVar3._0_8_;
  auVar573._8_8_ = 0;
  auVar573._0_8_ = uVar673 >> 0x34 | auVar3._8_8_ << 0xc;
  uVar671 = uVar671 * 2;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar675;
  auVar314._8_8_ = 0;
  auVar314._0_8_ = uVar671;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar683 * 2;
  auVar315._8_8_ = 0;
  auVar315._0_8_ = uVar687;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar670;
  auVar316._8_8_ = 0;
  auVar316._0_8_ = uVar670;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar666 >> 0x34 | SUB168(auVar698 * auVar313,8) << 0xc;
  auVar3 = auVar5 * auVar314 + auVar573 + auVar6 * auVar315 + auVar7 * auVar316 +
           auVar8 * ZEXT816(0x1000003d10);
  uVar666 = auVar3._0_8_;
  auVar574._8_8_ = 0;
  auVar574._0_8_ = uVar666 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = uVar675;
  auVar317._8_8_ = 0;
  auVar317._0_8_ = uVar675;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = uVar683;
  auVar318._8_8_ = 0;
  auVar318._0_8_ = uVar671;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = uVar670 * 2;
  auVar319._8_8_ = 0;
  auVar319._0_8_ = uVar687;
  auVar3 = auVar10 * auVar318 + auVar574 + auVar11 * auVar319;
  uVar674 = auVar3._0_8_;
  auVar576._8_8_ = 0;
  auVar576._0_8_ = uVar674 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar320._8_8_ = 0;
  auVar320._0_8_ = (uVar674 & 0xfffffffffffff) << 4 | (uVar666 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar9 * auVar317 + ZEXT816(0x1000003d1) * auVar320;
  uVar674 = auVar3._0_8_;
  local_80 = uVar674 & 0xfffffffffffff;
  auVar575._8_8_ = 0;
  auVar575._0_8_ = uVar674 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar675 * 2;
  auVar321._8_8_ = 0;
  auVar321._0_8_ = uVar683;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar670;
  auVar322._8_8_ = 0;
  auVar322._0_8_ = uVar671;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar687;
  auVar323._8_8_ = 0;
  auVar323._0_8_ = uVar687;
  auVar4 = auVar13 * auVar322 + auVar576 + auVar14 * auVar323;
  uVar674 = auVar4._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = uVar674 & 0xfffffffffffff;
  auVar3 = auVar12 * auVar321 + auVar575 + auVar15 * ZEXT816(0x1000003d10);
  uVar682 = auVar3._0_8_;
  auVar578._8_8_ = 0;
  auVar578._0_8_ = uVar674 >> 0x34 | auVar4._8_8_ << 0xc;
  local_78 = uVar682 & 0xfffffffffffff;
  auVar577._8_8_ = 0;
  auVar577._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar675 * 2;
  auVar324._8_8_ = 0;
  auVar324._0_8_ = uVar670;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar683;
  auVar325._8_8_ = 0;
  auVar325._0_8_ = uVar683;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar687;
  auVar326._8_8_ = 0;
  auVar326._0_8_ = uVar671;
  auVar578 = auVar18 * auVar326 + auVar578;
  uVar675 = auVar578._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar675 & 0xfffffffffffff;
  auVar3 = auVar16 * auVar324 + auVar577 + auVar17 * auVar325 + auVar19 * ZEXT816(0x1000003d10);
  uVar683 = auVar3._0_8_;
  local_70 = uVar683 & 0xfffffffffffff;
  auVar579._8_8_ = 0;
  auVar579._0_8_ = (uVar683 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar673 & 0xfffffffffffff);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = uVar675 >> 0x34 | auVar578._8_8_ << 0xc;
  auVar579 = auVar20 * ZEXT816(0x1000003d10) + auVar579;
  uVar675 = auVar579._0_8_;
  local_68 = uVar675 & 0xfffffffffffff;
  local_60 = (uVar675 >> 0x34 | auVar579._8_8_ << 0xc) + (uVar666 & 0xffffffffffff);
  uVar675 = (a->x).n[4];
  uVar673 = (uVar675 >> 0x30) * 0x1000003d1 + (a->x).n[0];
  uVar672 = (uVar673 >> 0x34) + (a->x).n[1];
  uVar673 = uVar673 & 0xfffffffffffff;
  uVar680 = (uVar672 >> 0x34) + (a->x).n[2];
  uVar672 = uVar672 & 0xfffffffffffff;
  uVar681 = (uVar680 >> 0x34) + (a->x).n[3];
  uVar680 = uVar680 & 0xfffffffffffff;
  uVar684 = (uVar681 >> 0x34) + (uVar675 & 0xffffffffffff);
  uVar681 = uVar681 & 0xfffffffffffff;
  uVar675 = (b->x).n[0];
  uVar683 = (b->x).n[1];
  uVar670 = (b->x).n[2];
  uVar687 = (b->x).n[3];
  uVar671 = (b->x).n[4];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_80;
  auVar327._8_8_ = 0;
  auVar327._0_8_ = uVar687;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_78;
  auVar328._8_8_ = 0;
  auVar328._0_8_ = uVar670;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_70;
  auVar329._8_8_ = 0;
  auVar329._0_8_ = uVar683;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_68;
  auVar330._8_8_ = 0;
  auVar330._0_8_ = uVar675;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_60;
  auVar331._8_8_ = 0;
  auVar331._0_8_ = uVar671;
  uVar666 = SUB168(auVar25 * auVar331,0);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = uVar666 & 0xfffffffffffff;
  auVar3 = auVar22 * auVar328 + auVar21 * auVar327 + auVar23 * auVar329 + auVar24 * auVar330 +
           auVar26 * ZEXT816(0x1000003d10);
  uVar674 = auVar3._0_8_;
  auVar580._8_8_ = 0;
  auVar580._0_8_ = uVar674 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_80;
  auVar332._8_8_ = 0;
  auVar332._0_8_ = uVar671;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_78;
  auVar333._8_8_ = 0;
  auVar333._0_8_ = uVar687;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_70;
  auVar334._8_8_ = 0;
  auVar334._0_8_ = uVar670;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = local_68;
  auVar335._8_8_ = 0;
  auVar335._0_8_ = uVar683;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_60;
  auVar336._8_8_ = 0;
  auVar336._0_8_ = uVar675;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = uVar666 >> 0x34 | SUB168(auVar25 * auVar331,8) << 0xc;
  auVar3 = auVar27 * auVar332 + auVar580 + auVar28 * auVar333 + auVar29 * auVar334 +
           auVar30 * auVar335 + auVar31 * auVar336 + auVar32 * ZEXT816(0x1000003d10);
  uVar666 = auVar3._0_8_;
  auVar581._8_8_ = 0;
  auVar581._0_8_ = uVar666 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_80;
  auVar337._8_8_ = 0;
  auVar337._0_8_ = uVar675;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = local_78;
  auVar338._8_8_ = 0;
  auVar338._0_8_ = uVar671;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = local_70;
  auVar339._8_8_ = 0;
  auVar339._0_8_ = uVar687;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = local_68;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = uVar670;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_60;
  auVar341._8_8_ = 0;
  auVar341._0_8_ = uVar683;
  auVar3 = auVar34 * auVar338 + auVar581 + auVar35 * auVar339 + auVar36 * auVar340 +
           auVar37 * auVar341;
  uVar682 = auVar3._0_8_;
  auVar583._8_8_ = 0;
  auVar583._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar342._8_8_ = 0;
  auVar342._0_8_ = (uVar682 & 0xfffffffffffff) << 4 | (uVar666 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar33 * auVar337 + ZEXT816(0x1000003d1) * auVar342;
  uVar682 = auVar3._0_8_;
  local_128 = uVar682 & 0xfffffffffffff;
  auVar582._8_8_ = 0;
  auVar582._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = local_80;
  auVar343._8_8_ = 0;
  auVar343._0_8_ = uVar683;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_78;
  auVar344._8_8_ = 0;
  auVar344._0_8_ = uVar675;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_70;
  auVar345._8_8_ = 0;
  auVar345._0_8_ = uVar671;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = local_68;
  auVar346._8_8_ = 0;
  auVar346._0_8_ = uVar687;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_60;
  auVar347._8_8_ = 0;
  auVar347._0_8_ = uVar670;
  auVar4 = auVar40 * auVar345 + auVar583 + auVar41 * auVar346 + auVar42 * auVar347;
  uVar682 = auVar4._0_8_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = uVar682 & 0xfffffffffffff;
  auVar3 = auVar38 * auVar343 + auVar582 + auVar39 * auVar344 + auVar43 * ZEXT816(0x1000003d10);
  uVar685 = auVar3._0_8_;
  auVar585._8_8_ = 0;
  auVar585._0_8_ = uVar682 >> 0x34 | auVar4._8_8_ << 0xc;
  uStack_120 = uVar685 & 0xfffffffffffff;
  auVar584._8_8_ = 0;
  auVar584._0_8_ = uVar685 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = local_80;
  auVar348._8_8_ = 0;
  auVar348._0_8_ = uVar670;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_78;
  auVar349._8_8_ = 0;
  auVar349._0_8_ = uVar683;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_70;
  auVar350._8_8_ = 0;
  auVar350._0_8_ = uVar675;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_68;
  auVar351._8_8_ = 0;
  auVar351._0_8_ = uVar671;
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_60;
  auVar352._8_8_ = 0;
  auVar352._0_8_ = uVar687;
  auVar4 = auVar47 * auVar351 + auVar585 + auVar48 * auVar352;
  uVar675 = auVar4._0_8_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = uVar675 & 0xfffffffffffff;
  auVar3 = auVar44 * auVar348 + auVar584 + auVar45 * auVar349 + auVar46 * auVar350 +
           auVar49 * ZEXT816(0x1000003d10);
  uVar683 = auVar3._0_8_;
  local_118 = uVar683 & 0xfffffffffffff;
  auVar586._8_8_ = 0;
  auVar586._0_8_ = (uVar683 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar674 & 0xfffffffffffff);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = uVar675 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar586 = auVar50 * ZEXT816(0x1000003d10) + auVar586;
  uVar675 = auVar586._0_8_;
  uStack_110 = uVar675 & 0xfffffffffffff;
  local_108 = (uVar675 >> 0x34 | auVar586._8_8_ << 0xc) + (uVar666 & 0xffffffffffff);
  uVar675 = (a->y).n[4];
  uVar674 = (uVar675 >> 0x30) * 0x1000003d1 + (a->y).n[0];
  uVar676 = (uVar674 >> 0x34) + (a->y).n[1];
  uVar677 = (uVar676 >> 0x34) + (a->y).n[2];
  uVar678 = (uVar677 >> 0x34) + (a->y).n[3];
  uVar683 = (b->y).n[0];
  uVar670 = (b->y).n[1];
  uVar687 = (b->y).n[2];
  uVar671 = (b->y).n[3];
  uVar666 = (b->y).n[4];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = local_80;
  auVar353._8_8_ = 0;
  auVar353._0_8_ = uVar671;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = local_78;
  auVar354._8_8_ = 0;
  auVar354._0_8_ = uVar687;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = local_70;
  auVar355._8_8_ = 0;
  auVar355._0_8_ = uVar670;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = local_68;
  auVar356._8_8_ = 0;
  auVar356._0_8_ = uVar683;
  auVar55._8_8_ = 0;
  auVar55._0_8_ = local_60;
  auVar357._8_8_ = 0;
  auVar357._0_8_ = uVar666;
  uVar682 = SUB168(auVar55 * auVar357,0);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = uVar682 & 0xfffffffffffff;
  auVar3 = auVar52 * auVar354 + auVar51 * auVar353 + auVar53 * auVar355 + auVar54 * auVar356 +
           auVar56 * ZEXT816(0x1000003d10);
  uVar668 = auVar3._0_8_;
  auVar587._8_8_ = 0;
  auVar587._0_8_ = uVar668 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = local_80;
  auVar358._8_8_ = 0;
  auVar358._0_8_ = uVar666;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_78;
  auVar359._8_8_ = 0;
  auVar359._0_8_ = uVar671;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = local_70;
  auVar360._8_8_ = 0;
  auVar360._0_8_ = uVar687;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = local_68;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = uVar670;
  auVar61._8_8_ = 0;
  auVar61._0_8_ = local_60;
  auVar362._8_8_ = 0;
  auVar362._0_8_ = uVar683;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = uVar682 >> 0x34 | SUB168(auVar55 * auVar357,8) << 0xc;
  auVar3 = auVar57 * auVar358 + auVar587 + auVar58 * auVar359 + auVar59 * auVar360 +
           auVar60 * auVar361 + auVar61 * auVar362 + auVar62 * ZEXT816(0x1000003d10);
  uVar669 = auVar3._0_8_;
  auVar588._8_8_ = 0;
  auVar588._0_8_ = uVar669 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_80;
  auVar363._8_8_ = 0;
  auVar363._0_8_ = uVar683;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = local_78;
  auVar364._8_8_ = 0;
  auVar364._0_8_ = uVar666;
  auVar65._8_8_ = 0;
  auVar65._0_8_ = local_70;
  auVar365._8_8_ = 0;
  auVar365._0_8_ = uVar671;
  auVar66._8_8_ = 0;
  auVar66._0_8_ = local_68;
  auVar366._8_8_ = 0;
  auVar366._0_8_ = uVar687;
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_60;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = uVar670;
  auVar3 = auVar64 * auVar364 + auVar588 + auVar65 * auVar365 + auVar66 * auVar366 +
           auVar67 * auVar367;
  uVar682 = auVar3._0_8_;
  auVar590._8_8_ = 0;
  auVar590._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar368._8_8_ = 0;
  auVar368._0_8_ = (uVar682 & 0xfffffffffffff) << 4 | (uVar669 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar63 * auVar363 + ZEXT816(0x1000003d1) * auVar368;
  uVar685 = auVar3._0_8_;
  uVar682 = uVar685 & 0xfffffffffffff;
  auVar589._8_8_ = 0;
  auVar589._0_8_ = uVar685 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_80;
  auVar369._8_8_ = 0;
  auVar369._0_8_ = uVar670;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = local_78;
  auVar370._8_8_ = 0;
  auVar370._0_8_ = uVar683;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_70;
  auVar371._8_8_ = 0;
  auVar371._0_8_ = uVar666;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_68;
  auVar372._8_8_ = 0;
  auVar372._0_8_ = uVar671;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = local_60;
  auVar373._8_8_ = 0;
  auVar373._0_8_ = uVar687;
  auVar4 = auVar70 * auVar371 + auVar590 + auVar71 * auVar372 + auVar72 * auVar373;
  uVar685 = auVar4._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = uVar685 & 0xfffffffffffff;
  auVar3 = auVar68 * auVar369 + auVar589 + auVar69 * auVar370 + auVar73 * ZEXT816(0x1000003d10);
  uVar686 = auVar3._0_8_;
  auVar592._8_8_ = 0;
  auVar592._0_8_ = uVar685 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar685 = uVar686 & 0xfffffffffffff;
  auVar591._8_8_ = 0;
  auVar591._0_8_ = uVar686 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_80;
  auVar374._8_8_ = 0;
  auVar374._0_8_ = uVar687;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = local_78;
  auVar375._8_8_ = 0;
  auVar375._0_8_ = uVar670;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = local_70;
  auVar376._8_8_ = 0;
  auVar376._0_8_ = uVar683;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_68;
  auVar377._8_8_ = 0;
  auVar377._0_8_ = uVar666;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = local_60;
  auVar378._8_8_ = 0;
  auVar378._0_8_ = uVar671;
  auVar4 = auVar77 * auVar377 + auVar592 + auVar78 * auVar378;
  uVar670 = auVar4._0_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = uVar670 & 0xfffffffffffff;
  auVar3 = auVar74 * auVar374 + auVar591 + auVar75 * auVar375 + auVar76 * auVar376 +
           auVar79 * ZEXT816(0x1000003d10);
  uVar687 = auVar3._0_8_;
  uVar683 = uVar687 & 0xfffffffffffff;
  auVar593._8_8_ = 0;
  auVar593._0_8_ = (uVar687 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar668 & 0xfffffffffffff);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = uVar670 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar593 = auVar80 * ZEXT816(0x1000003d10) + auVar593;
  uVar687 = auVar593._0_8_;
  uVar670 = uVar687 & 0xfffffffffffff;
  uVar668 = (uVar687 >> 0x34 | auVar593._8_8_ << 0xc) + (uVar669 & 0xffffffffffff);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = psVar679->n[0];
  auVar379._8_8_ = 0;
  auVar379._0_8_ = uVar670;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = (a->z).n[1];
  auVar380._8_8_ = 0;
  auVar380._0_8_ = uVar683;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = (a->z).n[2];
  auVar381._8_8_ = 0;
  auVar381._0_8_ = uVar685;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = (a->z).n[3];
  auVar382._8_8_ = 0;
  auVar382._0_8_ = uVar682;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = (a->z).n[4];
  auVar383._8_8_ = 0;
  auVar383._0_8_ = uVar668;
  uVar687 = SUB168(auVar85 * auVar383,0);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = uVar687 & 0xfffffffffffff;
  auVar3 = auVar82 * auVar380 + auVar81 * auVar379 + auVar83 * auVar381 + auVar84 * auVar382 +
           auVar86 * ZEXT816(0x1000003d10);
  uVar671 = auVar3._0_8_;
  auVar594._8_8_ = 0;
  auVar594._0_8_ = uVar671 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = psVar679->n[0];
  auVar384._8_8_ = 0;
  auVar384._0_8_ = uVar668;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = (a->z).n[1];
  auVar385._8_8_ = 0;
  auVar385._0_8_ = uVar670;
  auVar89._8_8_ = 0;
  auVar89._0_8_ = (a->z).n[2];
  auVar386._8_8_ = 0;
  auVar386._0_8_ = uVar683;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = (a->z).n[3];
  auVar387._8_8_ = 0;
  auVar387._0_8_ = uVar685;
  auVar91._8_8_ = 0;
  auVar91._0_8_ = (a->z).n[4];
  auVar388._8_8_ = 0;
  auVar388._0_8_ = uVar682;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = uVar687 >> 0x34 | SUB168(auVar85 * auVar383,8) << 0xc;
  auVar3 = auVar87 * auVar384 + auVar594 + auVar88 * auVar385 + auVar89 * auVar386 +
           auVar90 * auVar387 + auVar91 * auVar388 + auVar92 * ZEXT816(0x1000003d10);
  uVar687 = auVar3._0_8_;
  auVar595._8_8_ = 0;
  auVar595._0_8_ = uVar687 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar93._8_8_ = 0;
  auVar93._0_8_ = psVar679->n[0];
  auVar389._8_8_ = 0;
  auVar389._0_8_ = uVar682;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = (a->z).n[1];
  auVar390._8_8_ = 0;
  auVar390._0_8_ = uVar668;
  auVar95._8_8_ = 0;
  auVar95._0_8_ = (a->z).n[2];
  auVar391._8_8_ = 0;
  auVar391._0_8_ = uVar670;
  auVar96._8_8_ = 0;
  auVar96._0_8_ = (a->z).n[3];
  auVar392._8_8_ = 0;
  auVar392._0_8_ = uVar683;
  auVar97._8_8_ = 0;
  auVar97._0_8_ = (a->z).n[4];
  auVar393._8_8_ = 0;
  auVar393._0_8_ = uVar685;
  auVar3 = auVar94 * auVar390 + auVar595 + auVar95 * auVar391 + auVar96 * auVar392 +
           auVar97 * auVar393;
  uVar666 = auVar3._0_8_;
  auVar597._8_8_ = 0;
  auVar597._0_8_ = uVar666 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar394._8_8_ = 0;
  auVar394._0_8_ = (uVar666 & 0xfffffffffffff) << 4 | (uVar687 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar93 * auVar389 + ZEXT816(0x1000003d1) * auVar394;
  uVar666 = auVar3._0_8_;
  local_d8 = uVar666 & 0xfffffffffffff;
  auVar596._8_8_ = 0;
  auVar596._0_8_ = uVar666 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = psVar679->n[0];
  auVar395._8_8_ = 0;
  auVar395._0_8_ = uVar685;
  auVar99._8_8_ = 0;
  auVar99._0_8_ = (a->z).n[1];
  auVar396._8_8_ = 0;
  auVar396._0_8_ = uVar682;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = (a->z).n[2];
  auVar397._8_8_ = 0;
  auVar397._0_8_ = uVar668;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = (a->z).n[3];
  auVar398._8_8_ = 0;
  auVar398._0_8_ = uVar670;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = (a->z).n[4];
  auVar399._8_8_ = 0;
  auVar399._0_8_ = uVar683;
  auVar4 = auVar100 * auVar397 + auVar597 + auVar101 * auVar398 + auVar102 * auVar399;
  uVar666 = auVar4._0_8_;
  auVar103._8_8_ = 0;
  auVar103._0_8_ = uVar666 & 0xfffffffffffff;
  auVar3 = auVar98 * auVar395 + auVar596 + auVar99 * auVar396 + auVar103 * ZEXT816(0x1000003d10);
  uVar669 = auVar3._0_8_;
  auVar599._8_8_ = 0;
  auVar599._0_8_ = uVar666 >> 0x34 | auVar4._8_8_ << 0xc;
  uStack_d0 = uVar669 & 0xfffffffffffff;
  auVar598._8_8_ = 0;
  auVar598._0_8_ = uVar669 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar104._8_8_ = 0;
  auVar104._0_8_ = psVar679->n[0];
  auVar400._8_8_ = 0;
  auVar400._0_8_ = uVar683;
  auVar105._8_8_ = 0;
  auVar105._0_8_ = (a->z).n[1];
  auVar401._8_8_ = 0;
  auVar401._0_8_ = uVar685;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = (a->z).n[2];
  auVar402._8_8_ = 0;
  auVar402._0_8_ = uVar682;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = (a->z).n[3];
  auVar403._8_8_ = 0;
  auVar403._0_8_ = uVar668;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = (a->z).n[4];
  auVar404._8_8_ = 0;
  auVar404._0_8_ = uVar670;
  auVar4 = auVar107 * auVar403 + auVar599 + auVar108 * auVar404;
  uVar683 = auVar4._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = uVar683 & 0xfffffffffffff;
  auVar3 = auVar104 * auVar400 + auVar598 + auVar105 * auVar401 + auVar106 * auVar402 +
           auVar109 * ZEXT816(0x1000003d10);
  uVar670 = auVar3._0_8_;
  local_c8 = uVar670 & 0xfffffffffffff;
  auVar600._8_8_ = 0;
  auVar600._0_8_ = (uVar670 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar671 & 0xfffffffffffff);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = uVar683 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar600 = auVar110 * ZEXT816(0x1000003d10) + auVar600;
  uVar683 = auVar600._0_8_;
  uStack_c0 = uVar683 & 0xfffffffffffff;
  local_b8 = (uVar683 >> 0x34 | auVar600._8_8_ << 0xc) + (uVar687 & 0xffffffffffff);
  uVar694 = uVar673 + local_128;
  uVar699 = uVar672 + uStack_120;
  uVar695 = uVar680 + local_118;
  uVar700 = uVar681 + uStack_110;
  uVar670 = uVar684 + local_108;
  uVar677 = uVar677 & 0xfffffffffffff;
  uVar707 = uVar678 & 0xfffffffffffff;
  uVar674 = uVar674 & 0xfffffffffffff;
  uVar676 = uVar676 & 0xfffffffffffff;
  uVar704 = uVar674 + local_d8;
  uVar706 = uVar676 + uStack_d0;
  uVar696 = uVar677 + local_c8;
  uVar701 = uVar707 + uStack_c0;
  auVar111._8_8_ = 0;
  auVar111._0_8_ = uVar694 * 2;
  auVar405._8_8_ = 0;
  auVar405._0_8_ = uVar700;
  auVar112._8_8_ = 0;
  auVar112._0_8_ = uVar699 * 2;
  auVar406._8_8_ = 0;
  auVar406._0_8_ = uVar695;
  auVar113._8_8_ = 0;
  auVar113._0_8_ = uVar670;
  auVar407._8_8_ = 0;
  auVar407._0_8_ = uVar670;
  uVar687 = SUB168(auVar113 * auVar407,0);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar687 & 0xfffffffffffff;
  auVar3 = auVar112 * auVar406 + auVar111 * auVar405 + auVar114 * ZEXT816(0x1000003d10);
  uVar671 = auVar3._0_8_;
  auVar601._8_8_ = 0;
  auVar601._0_8_ = uVar671 >> 0x34 | auVar3._8_8_ << 0xc;
  uVar683 = uVar670 * 2;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar694;
  auVar408._8_8_ = 0;
  auVar408._0_8_ = uVar683;
  auVar116._8_8_ = 0;
  auVar116._0_8_ = uVar699 * 2;
  auVar409._8_8_ = 0;
  auVar409._0_8_ = uVar700;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = uVar695;
  auVar410._8_8_ = 0;
  auVar410._0_8_ = uVar695;
  auVar118._8_8_ = 0;
  auVar118._0_8_ = uVar687 >> 0x34 | SUB168(auVar113 * auVar407,8) << 0xc;
  auVar3 = auVar115 * auVar408 + auVar601 + auVar116 * auVar409 + auVar117 * auVar410 +
           auVar118 * ZEXT816(0x1000003d10);
  uVar687 = auVar3._0_8_;
  auVar602._8_8_ = 0;
  auVar602._0_8_ = uVar687 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = uVar694;
  auVar411._8_8_ = 0;
  auVar411._0_8_ = uVar694;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = uVar699;
  auVar412._8_8_ = 0;
  auVar412._0_8_ = uVar683;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = uVar695 * 2;
  auVar413._8_8_ = 0;
  auVar413._0_8_ = uVar700;
  auVar3 = auVar120 * auVar412 + auVar602 + auVar121 * auVar413;
  uVar666 = auVar3._0_8_;
  auVar604._8_8_ = 0;
  auVar604._0_8_ = uVar666 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar414._8_8_ = 0;
  auVar414._0_8_ = (uVar666 & 0xfffffffffffff) << 4 | (uVar687 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar119 * auVar411 + ZEXT816(0x1000003d1) * auVar414;
  uVar682 = auVar3._0_8_;
  auVar603._8_8_ = 0;
  auVar603._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = uVar694 * 2;
  auVar415._8_8_ = 0;
  auVar415._0_8_ = uVar699;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = uVar695;
  auVar416._8_8_ = 0;
  auVar416._0_8_ = uVar683;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = uVar700;
  auVar417._8_8_ = 0;
  auVar417._0_8_ = uVar700;
  auVar4 = auVar123 * auVar416 + auVar604 + auVar124 * auVar417;
  uVar666 = auVar4._0_8_;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = uVar666 & 0xfffffffffffff;
  auVar3 = auVar122 * auVar415 + auVar603 + auVar125 * ZEXT816(0x1000003d10);
  uVar685 = auVar3._0_8_;
  auVar606._8_8_ = 0;
  auVar606._0_8_ = uVar666 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar605._8_8_ = 0;
  auVar605._0_8_ = uVar685 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = uVar694 * 2;
  auVar418._8_8_ = 0;
  auVar418._0_8_ = uVar695;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = uVar699;
  auVar419._8_8_ = 0;
  auVar419._0_8_ = uVar699;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = uVar700;
  auVar420._8_8_ = 0;
  auVar420._0_8_ = uVar683;
  auVar606 = auVar128 * auVar420 + auVar606;
  uVar683 = auVar606._0_8_;
  auVar129._8_8_ = 0;
  auVar129._0_8_ = uVar683 & 0xfffffffffffff;
  auVar3 = auVar126 * auVar418 + auVar605 + auVar127 * auVar419 + auVar129 * ZEXT816(0x1000003d10);
  uVar666 = auVar3._0_8_;
  auVar607._8_8_ = 0;
  auVar607._0_8_ = (uVar666 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar671 & 0xfffffffffffff);
  auVar130._8_8_ = 0;
  auVar130._0_8_ = uVar683 >> 0x34 | auVar606._8_8_ << 0xc;
  auVar607 = auVar130 * ZEXT816(0x1000003d10) + auVar607;
  uVar671 = auVar607._0_8_;
  local_158 = 0x3ffffbfffff0bc - local_128;
  uStack_150 = 0x3ffffffffffffc - uStack_120;
  lVar667 = (uVar678 >> 0x34) + (uVar675 & 0xffffffffffff);
  local_148 = 0x3ffffffffffffc - local_118;
  uStack_140 = 0x3ffffffffffffc - uStack_110;
  local_138 = 0x3fffffffffffc - local_108;
  auVar131._8_8_ = 0;
  auVar131._0_8_ = local_158;
  auVar421._8_8_ = 0;
  auVar421._0_8_ = uVar681;
  auVar132._8_8_ = 0;
  auVar132._0_8_ = uStack_150;
  auVar422._8_8_ = 0;
  auVar422._0_8_ = uVar680;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = local_148;
  auVar423._8_8_ = 0;
  auVar423._0_8_ = uVar672;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = uStack_140;
  auVar424._8_8_ = 0;
  auVar424._0_8_ = uVar673;
  auVar135._8_8_ = 0;
  auVar135._0_8_ = local_138;
  auVar425._8_8_ = 0;
  auVar425._0_8_ = uVar684;
  uVar675 = SUB168(auVar135 * auVar425,0);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = uVar675 & 0xfffffffffffff;
  auVar3 = auVar132 * auVar422 + auVar131 * auVar421 + auVar133 * auVar423 + auVar134 * auVar424 +
           auVar136 * ZEXT816(0x1000003d10);
  uVar683 = auVar3._0_8_;
  local_180.n[0] = uVar683 & 0xfffffffffffff;
  auVar608._8_8_ = 0;
  auVar608._0_8_ = uVar683 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = local_158;
  auVar426._8_8_ = 0;
  auVar426._0_8_ = uVar684;
  auVar138._8_8_ = 0;
  auVar138._0_8_ = uStack_150;
  auVar427._8_8_ = 0;
  auVar427._0_8_ = uVar681;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = local_148;
  auVar428._8_8_ = 0;
  auVar428._0_8_ = uVar680;
  auVar140._8_8_ = 0;
  auVar140._0_8_ = uStack_140;
  auVar429._8_8_ = 0;
  auVar429._0_8_ = uVar672;
  auVar141._8_8_ = 0;
  auVar141._0_8_ = local_138;
  auVar430._8_8_ = 0;
  auVar430._0_8_ = uVar673;
  auVar142._8_8_ = 0;
  auVar142._0_8_ = uVar675 >> 0x34 | SUB168(auVar135 * auVar425,8) << 0xc;
  auVar3 = auVar137 * auVar426 + auVar608 + auVar138 * auVar427 + auVar139 * auVar428 +
           auVar140 * auVar429 + auVar141 * auVar430 + auVar142 * ZEXT816(0x1000003d10);
  uVar675 = auVar3._0_8_;
  auVar609._8_8_ = 0;
  auVar609._0_8_ = uVar675 >> 0x34 | auVar3._8_8_ << 0xc;
  local_100 = (uVar675 & 0xfffffffffffff) >> 0x30;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = local_158;
  auVar431._8_8_ = 0;
  auVar431._0_8_ = uVar673;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = uStack_150;
  auVar432._8_8_ = 0;
  auVar432._0_8_ = uVar684;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = local_148;
  auVar433._8_8_ = 0;
  auVar433._0_8_ = uVar681;
  auVar146._8_8_ = 0;
  auVar146._0_8_ = uStack_140;
  auVar434._8_8_ = 0;
  auVar434._0_8_ = uVar680;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = local_138;
  auVar435._8_8_ = 0;
  auVar435._0_8_ = uVar672;
  auVar3 = auVar144 * auVar432 + auVar609 + auVar145 * auVar433 + auVar146 * auVar434 +
           auVar147 * auVar435;
  uVar683 = auVar3._0_8_;
  auVar611._8_8_ = 0;
  auVar611._0_8_ = uVar683 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar436._8_8_ = 0;
  auVar436._0_8_ = (uVar683 & 0xfffffffffffff) << 4 | local_100;
  auVar3 = auVar143 * auVar431 + ZEXT816(0x1000003d1) * auVar436;
  uVar668 = auVar3._0_8_;
  auVar610._8_8_ = 0;
  auVar610._0_8_ = uVar668 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar148._8_8_ = 0;
  auVar148._0_8_ = local_158;
  auVar437._8_8_ = 0;
  auVar437._0_8_ = uVar672;
  auVar149._8_8_ = 0;
  auVar149._0_8_ = uStack_150;
  auVar438._8_8_ = 0;
  auVar438._0_8_ = uVar673;
  auVar150._8_8_ = 0;
  auVar150._0_8_ = local_148;
  auVar439._8_8_ = 0;
  auVar439._0_8_ = uVar684;
  auVar151._8_8_ = 0;
  auVar151._0_8_ = uStack_140;
  auVar440._8_8_ = 0;
  auVar440._0_8_ = uVar681;
  auVar152._8_8_ = 0;
  auVar152._0_8_ = local_138;
  auVar441._8_8_ = 0;
  auVar441._0_8_ = uVar680;
  auVar4 = auVar150 * auVar439 + auVar611 + auVar151 * auVar440 + auVar152 * auVar441;
  uVar683 = auVar4._0_8_;
  auVar153._8_8_ = 0;
  auVar153._0_8_ = uVar683 & 0xfffffffffffff;
  auVar3 = auVar148 * auVar437 + auVar610 + auVar149 * auVar438 + auVar153 * ZEXT816(0x1000003d10);
  uVar669 = auVar3._0_8_;
  auVar613._8_8_ = 0;
  auVar613._0_8_ = uVar683 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar612._8_8_ = 0;
  auVar612._0_8_ = uVar669 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = local_158;
  auVar442._8_8_ = 0;
  auVar442._0_8_ = uVar680;
  auVar155._8_8_ = 0;
  auVar155._0_8_ = uStack_150;
  auVar443._8_8_ = 0;
  auVar443._0_8_ = uVar672;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = local_148;
  auVar444._8_8_ = 0;
  auVar444._0_8_ = uVar673;
  auVar157._8_8_ = 0;
  auVar157._0_8_ = uStack_140;
  auVar445._8_8_ = 0;
  auVar445._0_8_ = uVar684;
  auVar158._8_8_ = 0;
  auVar158._0_8_ = local_138;
  auVar446._8_8_ = 0;
  auVar446._0_8_ = uVar681;
  auVar4 = auVar157 * auVar445 + auVar613 + auVar158 * auVar446;
  uVar683 = auVar4._0_8_;
  auVar159._8_8_ = 0;
  auVar159._0_8_ = uVar683 & 0xfffffffffffff;
  auVar3 = auVar154 * auVar442 + auVar612 + auVar155 * auVar443 + auVar156 * auVar444 +
           auVar159 * ZEXT816(0x1000003d10);
  uVar678 = auVar3._0_8_;
  auVar614._8_8_ = 0;
  auVar614._0_8_ = (uVar678 >> 0x34 | auVar3._8_8_ << 0xc) + local_180.n[0];
  auVar160._8_8_ = 0;
  auVar160._0_8_ = uVar683 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar614 = auVar160 * ZEXT816(0x1000003d10) + auVar614;
  uVar683 = auVar614._0_8_;
  uVar688 = (uVar682 & 0xfffffffffffff) + (uVar668 & 0xfffffffffffff);
  uVar693 = (uVar685 & 0xfffffffffffff) + (uVar669 & 0xfffffffffffff);
  uVar697 = (uVar666 & 0xfffffffffffff) + (uVar678 & 0xfffffffffffff);
  uVar702 = (uVar671 & 0xfffffffffffff) + (uVar683 & 0xfffffffffffff);
  uVar687 = (uVar671 >> 0x34 | auVar607._8_8_ << 0xc) + (uVar687 & 0xffffffffffff) +
            (uVar683 >> 0x34 | auVar614._8_8_ << 0xc) + (uVar675 & 0xffffffffffff);
  uVar686 = local_b8 + lVar667;
  local_58.n[0] = uVar688;
  local_58.n[1] = uVar693;
  local_58.n[2] = uVar697;
  local_58.n[3] = uVar702;
  local_58.n[4] = uVar687;
  uVar663 = secp256k1_fe_normalizes_to_zero(&local_58);
  uVar673 = local_158 + uVar673;
  uVar672 = uStack_150 + uVar672;
  uVar680 = local_148 + uVar680;
  uVar681 = uStack_140 + uVar681;
  uVar684 = local_138 + uVar684;
  local_180.n[0] = uVar704;
  local_180.n[1] = uVar706;
  local_180.n[2] = uVar696;
  local_180.n[3] = uVar701;
  local_180.n[4] = uVar686;
  uVar664 = secp256k1_fe_normalizes_to_zero(&local_180);
  uVar664 = uVar664 & uVar663;
  uVar675 = (ulong)(uVar664 ^ 1) - 1;
  uVar683 = -(ulong)(uVar664 ^ 1);
  local_88 = uVar687 & uVar683 | lVar667 * 2 & uVar675;
  auVar689._8_4_ = (int)uVar675;
  auVar689._0_8_ = uVar675;
  auVar689._12_4_ = (int)(uVar675 >> 0x20);
  auVar659._8_8_ = uVar707 * 2;
  auVar659._0_8_ = uVar677 * 2;
  auVar660._8_8_ = uVar676 * 2;
  auVar660._0_8_ = uVar674 * 2;
  auVar690._8_4_ = (int)uVar683;
  auVar690._0_8_ = uVar683;
  auVar690._12_4_ = (int)(uVar683 >> 0x20);
  auVar661._8_8_ = uVar702;
  auVar661._0_8_ = uVar697;
  local_98 = auVar661 & auVar690 | auVar659 & auVar689;
  auVar662._8_8_ = uVar693;
  auVar662._0_8_ = uVar688;
  local_a8 = auVar662 & auVar690 | auVar660 & auVar689;
  local_158 = uVar704 & uVar683 | uVar673 & uVar675;
  uStack_150 = uVar706 & uVar683 | uVar672 & uVar675;
  local_148 = uVar696 & uVar683 | uVar680 & uVar675;
  uStack_140 = uVar701 & uVar683 | uVar681 & uVar675;
  local_138 = uVar683 & uVar686 | uVar684 & uVar675;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = local_158 * 2;
  auVar447._8_8_ = 0;
  auVar447._0_8_ = uStack_140;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = uStack_150 * 2;
  auVar448._8_8_ = 0;
  auVar448._0_8_ = local_148;
  auVar163._8_8_ = 0;
  auVar163._0_8_ = local_138;
  auVar449._8_8_ = 0;
  auVar449._0_8_ = local_138;
  uVar683 = SUB168(auVar163 * auVar449,0);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = uVar683 & 0xfffffffffffff;
  auVar3 = auVar162 * auVar448 + auVar161 * auVar447 + auVar164 * ZEXT816(0x1000003d10);
  uVar666 = auVar3._0_8_;
  auVar615._8_8_ = 0;
  auVar615._0_8_ = uVar666 >> 0x34 | auVar3._8_8_ << 0xc;
  uVar675 = local_138 * 2;
  auVar165._8_8_ = 0;
  auVar165._0_8_ = local_158;
  auVar450._8_8_ = 0;
  auVar450._0_8_ = uVar675;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = uStack_150 * 2;
  auVar451._8_8_ = 0;
  auVar451._0_8_ = uStack_140;
  auVar167._8_8_ = 0;
  auVar167._0_8_ = local_148;
  auVar452._8_8_ = 0;
  auVar452._0_8_ = local_148;
  auVar168._8_8_ = 0;
  auVar168._0_8_ = uVar683 >> 0x34 | SUB168(auVar163 * auVar449,8) << 0xc;
  auVar3 = auVar165 * auVar450 + auVar615 + auVar166 * auVar451 + auVar167 * auVar452 +
           auVar168 * ZEXT816(0x1000003d10);
  uVar673 = auVar3._0_8_;
  auVar616._8_8_ = 0;
  auVar616._0_8_ = uVar673 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar169._8_8_ = 0;
  auVar169._0_8_ = local_158;
  auVar453._8_8_ = 0;
  auVar453._0_8_ = local_158;
  auVar170._8_8_ = 0;
  auVar170._0_8_ = uStack_150;
  auVar454._8_8_ = 0;
  auVar454._0_8_ = uVar675;
  auVar171._8_8_ = 0;
  auVar171._0_8_ = local_148 * 2;
  auVar455._8_8_ = 0;
  auVar455._0_8_ = uStack_140;
  auVar3 = auVar170 * auVar454 + auVar616 + auVar171 * auVar455;
  uVar683 = auVar3._0_8_;
  auVar618._8_8_ = 0;
  auVar618._0_8_ = uVar683 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar456._8_8_ = 0;
  auVar456._0_8_ = (uVar683 & 0xfffffffffffff) << 4 | (uVar673 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar169 * auVar453 + ZEXT816(0x1000003d1) * auVar456;
  uVar687 = auVar3._0_8_;
  uVar683 = uVar687 & 0xfffffffffffff;
  auVar617._8_8_ = 0;
  auVar617._0_8_ = uVar687 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar172._8_8_ = 0;
  auVar172._0_8_ = local_158 * 2;
  auVar457._8_8_ = 0;
  auVar457._0_8_ = uStack_150;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = local_148;
  auVar458._8_8_ = 0;
  auVar458._0_8_ = uVar675;
  auVar174._8_8_ = 0;
  auVar174._0_8_ = uStack_140;
  auVar459._8_8_ = 0;
  auVar459._0_8_ = uStack_140;
  auVar4 = auVar173 * auVar458 + auVar618 + auVar174 * auVar459;
  uVar687 = auVar4._0_8_;
  auVar175._8_8_ = 0;
  auVar175._0_8_ = uVar687 & 0xfffffffffffff;
  auVar3 = auVar172 * auVar457 + auVar617 + auVar175 * ZEXT816(0x1000003d10);
  uVar671 = auVar3._0_8_;
  auVar620._8_8_ = 0;
  auVar620._0_8_ = uVar687 >> 0x34 | auVar4._8_8_ << 0xc;
  uVar687 = uVar671 & 0xfffffffffffff;
  auVar619._8_8_ = 0;
  auVar619._0_8_ = uVar671 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = local_158 * 2;
  auVar460._8_8_ = 0;
  auVar460._0_8_ = local_148;
  auVar177._8_8_ = 0;
  auVar177._0_8_ = uStack_150;
  auVar461._8_8_ = 0;
  auVar461._0_8_ = uStack_150;
  auVar178._8_8_ = 0;
  auVar178._0_8_ = uStack_140;
  auVar462._8_8_ = 0;
  auVar462._0_8_ = uVar675;
  auVar620 = auVar178 * auVar462 + auVar620;
  uVar675 = auVar620._0_8_;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = uVar675 & 0xfffffffffffff;
  auVar3 = auVar176 * auVar460 + auVar619 + auVar177 * auVar461 + auVar179 * ZEXT816(0x1000003d10);
  uVar674 = auVar3._0_8_;
  uVar671 = uVar674 & 0xfffffffffffff;
  auVar621._8_8_ = 0;
  auVar621._0_8_ = (uVar674 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar666 & 0xfffffffffffff);
  auVar180._8_8_ = 0;
  auVar180._0_8_ = uVar675 >> 0x34 | auVar620._8_8_ << 0xc;
  auVar621 = auVar180 * ZEXT816(0x1000003d10) + auVar621;
  uVar675 = auVar621._0_8_;
  uVar666 = uVar675 & 0xfffffffffffff;
  uVar675 = (uVar675 >> 0x34 | auVar621._8_8_ << 0xc) + (uVar673 & 0xffffffffffff);
  auVar181._8_8_ = 0;
  auVar181._0_8_ = uVar694;
  auVar463._8_8_ = 0;
  auVar463._0_8_ = uVar666;
  auVar182._8_8_ = 0;
  auVar182._0_8_ = uVar699;
  auVar464._8_8_ = 0;
  auVar464._0_8_ = uVar671;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = uVar695;
  auVar465._8_8_ = 0;
  auVar465._0_8_ = uVar687;
  auVar184._8_8_ = 0;
  auVar184._0_8_ = uVar700;
  auVar466._8_8_ = 0;
  auVar466._0_8_ = uVar683;
  auVar185._8_8_ = 0;
  auVar185._0_8_ = uVar670;
  auVar467._8_8_ = 0;
  auVar467._0_8_ = uVar675;
  uVar673 = SUB168(auVar185 * auVar467,0);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = uVar673 & 0xfffffffffffff;
  auVar3 = auVar182 * auVar464 + auVar181 * auVar463 + auVar183 * auVar465 + auVar184 * auVar466 +
           auVar186 * ZEXT816(0x1000003d10);
  uVar674 = auVar3._0_8_;
  auVar622._8_8_ = 0;
  auVar622._0_8_ = uVar674 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = uVar694;
  auVar468._8_8_ = 0;
  auVar468._0_8_ = uVar675;
  auVar188._8_8_ = 0;
  auVar188._0_8_ = uVar699;
  auVar469._8_8_ = 0;
  auVar469._0_8_ = uVar666;
  auVar189._8_8_ = 0;
  auVar189._0_8_ = uVar695;
  auVar470._8_8_ = 0;
  auVar470._0_8_ = uVar671;
  auVar190._8_8_ = 0;
  auVar190._0_8_ = uVar700;
  auVar471._8_8_ = 0;
  auVar471._0_8_ = uVar687;
  auVar191._8_8_ = 0;
  auVar191._0_8_ = uVar670;
  auVar472._8_8_ = 0;
  auVar472._0_8_ = uVar683;
  auVar192._8_8_ = 0;
  auVar192._0_8_ = uVar673 >> 0x34 | SUB168(auVar185 * auVar467,8) << 0xc;
  auVar3 = auVar187 * auVar468 + auVar622 + auVar188 * auVar469 + auVar189 * auVar470 +
           auVar190 * auVar471 + auVar191 * auVar472 + auVar192 * ZEXT816(0x1000003d10);
  uVar673 = auVar3._0_8_;
  auVar623._8_8_ = 0;
  auVar623._0_8_ = uVar673 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar193._8_8_ = 0;
  auVar193._0_8_ = uVar694;
  auVar473._8_8_ = 0;
  auVar473._0_8_ = uVar683;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = uVar699;
  auVar474._8_8_ = 0;
  auVar474._0_8_ = uVar675;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = uVar695;
  auVar475._8_8_ = 0;
  auVar475._0_8_ = uVar666;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = uVar700;
  auVar476._8_8_ = 0;
  auVar476._0_8_ = uVar671;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = uVar670;
  auVar477._8_8_ = 0;
  auVar477._0_8_ = uVar687;
  auVar3 = auVar194 * auVar474 + auVar623 + auVar195 * auVar475 + auVar196 * auVar476 +
           auVar197 * auVar477;
  uVar682 = auVar3._0_8_;
  auVar625._8_8_ = 0;
  auVar625._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar478._8_8_ = 0;
  auVar478._0_8_ = (uVar682 & 0xfffffffffffff) << 4 | (uVar673 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar193 * auVar473 + ZEXT816(0x1000003d1) * auVar478;
  uVar682 = auVar3._0_8_;
  local_100 = uVar682 & 0xfffffffffffff;
  auVar624._8_8_ = 0;
  auVar624._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = uVar694;
  auVar479._8_8_ = 0;
  auVar479._0_8_ = uVar687;
  auVar199._8_8_ = 0;
  auVar199._0_8_ = uVar699;
  auVar480._8_8_ = 0;
  auVar480._0_8_ = uVar683;
  auVar200._8_8_ = 0;
  auVar200._0_8_ = uVar695;
  auVar481._8_8_ = 0;
  auVar481._0_8_ = uVar675;
  auVar201._8_8_ = 0;
  auVar201._0_8_ = uVar700;
  auVar482._8_8_ = 0;
  auVar482._0_8_ = uVar666;
  auVar202._8_8_ = 0;
  auVar202._0_8_ = uVar670;
  auVar483._8_8_ = 0;
  auVar483._0_8_ = uVar671;
  auVar4 = auVar200 * auVar481 + auVar625 + auVar201 * auVar482 + auVar202 * auVar483;
  uVar682 = auVar4._0_8_;
  auVar203._8_8_ = 0;
  auVar203._0_8_ = uVar682 & 0xfffffffffffff;
  auVar3 = auVar198 * auVar479 + auVar624 + auVar199 * auVar480 + auVar203 * ZEXT816(0x1000003d10);
  uVar685 = auVar3._0_8_;
  auVar627._8_8_ = 0;
  auVar627._0_8_ = uVar682 >> 0x34 | auVar4._8_8_ << 0xc;
  local_f8 = uVar685 & 0xfffffffffffff;
  auVar626._8_8_ = 0;
  auVar626._0_8_ = uVar685 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar204._8_8_ = 0;
  auVar204._0_8_ = uVar694;
  auVar484._8_8_ = 0;
  auVar484._0_8_ = uVar671;
  auVar205._8_8_ = 0;
  auVar205._0_8_ = uVar699;
  auVar485._8_8_ = 0;
  auVar485._0_8_ = uVar687;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = uVar695;
  auVar486._8_8_ = 0;
  auVar486._0_8_ = uVar683;
  auVar207._8_8_ = 0;
  auVar207._0_8_ = uVar700;
  auVar487._8_8_ = 0;
  auVar487._0_8_ = uVar675;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = uVar670;
  auVar488._8_8_ = 0;
  auVar488._0_8_ = uVar666;
  auVar4 = auVar207 * auVar487 + auVar627 + auVar208 * auVar488;
  uVar670 = auVar4._0_8_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = uVar670 & 0xfffffffffffff;
  auVar3 = auVar204 * auVar484 + auVar626 + auVar205 * auVar485 + auVar206 * auVar486 +
           auVar209 * ZEXT816(0x1000003d10);
  uVar682 = auVar3._0_8_;
  local_f0 = uVar682 & 0xfffffffffffff;
  auVar628._8_8_ = 0;
  auVar628._0_8_ = (uVar682 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar674 & 0xfffffffffffff);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = uVar670 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar628 = auVar210 * ZEXT816(0x1000003d10) + auVar628;
  uVar670 = auVar628._0_8_;
  local_e8 = uVar670 & 0xfffffffffffff;
  local_e0 = (uVar670 >> 0x34 | auVar628._8_8_ << 0xc) + (uVar673 & 0xffffffffffff);
  auVar211._8_8_ = 0;
  auVar211._0_8_ = uVar683 * 2;
  auVar489._8_8_ = 0;
  auVar489._0_8_ = uVar666;
  auVar212._8_8_ = 0;
  auVar212._0_8_ = uVar687 * 2;
  auVar490._8_8_ = 0;
  auVar490._0_8_ = uVar671;
  auVar213._8_8_ = 0;
  auVar213._0_8_ = uVar675;
  auVar491._8_8_ = 0;
  auVar491._0_8_ = uVar675;
  uVar670 = SUB168(auVar213 * auVar491,0);
  auVar214._8_8_ = 0;
  auVar214._0_8_ = uVar670 & 0xfffffffffffff;
  auVar3 = auVar212 * auVar490 + auVar211 * auVar489 + auVar214 * ZEXT816(0x1000003d10);
  uVar673 = auVar3._0_8_;
  auVar629._8_8_ = 0;
  auVar629._0_8_ = uVar673 >> 0x34 | auVar3._8_8_ << 0xc;
  uVar675 = uVar675 * 2;
  auVar215._8_8_ = 0;
  auVar215._0_8_ = uVar683;
  auVar492._8_8_ = 0;
  auVar492._0_8_ = uVar675;
  auVar216._8_8_ = 0;
  auVar216._0_8_ = uVar687 * 2;
  auVar493._8_8_ = 0;
  auVar493._0_8_ = uVar666;
  auVar217._8_8_ = 0;
  auVar217._0_8_ = uVar671;
  auVar494._8_8_ = 0;
  auVar494._0_8_ = uVar671;
  auVar218._8_8_ = 0;
  auVar218._0_8_ = uVar670 >> 0x34 | SUB168(auVar213 * auVar491,8) << 0xc;
  auVar3 = auVar215 * auVar492 + auVar629 + auVar216 * auVar493 + auVar217 * auVar494 +
           auVar218 * ZEXT816(0x1000003d10);
  uVar685 = auVar3._0_8_;
  auVar630._8_8_ = 0;
  auVar630._0_8_ = uVar685 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar219._8_8_ = 0;
  auVar219._0_8_ = uVar683;
  auVar495._8_8_ = 0;
  auVar495._0_8_ = uVar683;
  auVar220._8_8_ = 0;
  auVar220._0_8_ = uVar687;
  auVar496._8_8_ = 0;
  auVar496._0_8_ = uVar675;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = uVar671 * 2;
  auVar497._8_8_ = 0;
  auVar497._0_8_ = uVar666;
  auVar3 = auVar220 * auVar496 + auVar630 + auVar221 * auVar497;
  uVar670 = auVar3._0_8_;
  auVar632._8_8_ = 0;
  auVar632._0_8_ = uVar670 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar498._8_8_ = 0;
  auVar498._0_8_ = (uVar670 & 0xfffffffffffff) << 4 | (uVar685 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar219 * auVar495 + ZEXT816(0x1000003d1) * auVar498;
  uVar674 = auVar3._0_8_;
  auVar631._8_8_ = 0;
  auVar631._0_8_ = uVar674 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar222._8_8_ = 0;
  auVar222._0_8_ = uVar683 * 2;
  auVar499._8_8_ = 0;
  auVar499._0_8_ = uVar687;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = uVar671;
  auVar500._8_8_ = 0;
  auVar500._0_8_ = uVar675;
  auVar224._8_8_ = 0;
  auVar224._0_8_ = uVar666;
  auVar501._8_8_ = 0;
  auVar501._0_8_ = uVar666;
  auVar4 = auVar223 * auVar500 + auVar632 + auVar224 * auVar501;
  uVar670 = auVar4._0_8_;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = uVar670 & 0xfffffffffffff;
  auVar3 = auVar222 * auVar499 + auVar631 + auVar225 * ZEXT816(0x1000003d10);
  uVar682 = auVar3._0_8_;
  auVar634._8_8_ = 0;
  auVar634._0_8_ = uVar670 >> 0x34 | auVar4._8_8_ << 0xc;
  local_248._8_8_ = uVar682 & 0xfffffffffffff;
  local_248._0_8_ = uVar674 & 0xfffffffffffff;
  auVar633._8_8_ = 0;
  auVar633._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar226._8_8_ = 0;
  auVar226._0_8_ = uVar683 * 2;
  auVar502._8_8_ = 0;
  auVar502._0_8_ = uVar671;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = uVar687;
  auVar503._8_8_ = 0;
  auVar503._0_8_ = uVar687;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = uVar666;
  auVar504._8_8_ = 0;
  auVar504._0_8_ = uVar675;
  auVar634 = auVar228 * auVar504 + auVar634;
  uVar675 = auVar634._0_8_;
  auVar229._8_8_ = 0;
  auVar229._0_8_ = uVar675 & 0xfffffffffffff;
  auVar3 = auVar226 * auVar502 + auVar633 + auVar227 * auVar503 + auVar229 * ZEXT816(0x1000003d10);
  uVar683 = auVar3._0_8_;
  auVar635._8_8_ = 0;
  auVar635._0_8_ = (uVar683 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar673 & 0xfffffffffffff);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = uVar675 >> 0x34 | auVar634._8_8_ << 0xc;
  auVar635 = auVar230 * ZEXT816(0x1000003d10) + auVar635;
  uVar672 = auVar635._0_8_;
  local_238._8_8_ = uVar672 & 0xfffffffffffff;
  local_238._0_8_ = uVar683 & 0xfffffffffffff;
  uVar675 = (ulong)uVar664 - 1;
  uVar669 = -(ulong)uVar664;
  auVar691._8_4_ = (int)uVar675;
  auVar691._0_8_ = uVar675;
  auVar691._12_4_ = (int)(uVar675 >> 0x20);
  auVar703._8_4_ = (int)uVar669;
  auVar703._0_8_ = uVar669;
  auVar703._12_4_ = (int)(uVar669 >> 0x20);
  auVar658._8_8_ = uVar706;
  auVar658._0_8_ = uVar704;
  auVar705 = auVar658 & auVar703 | local_248 & auVar691;
  auVar657._8_8_ = uVar701;
  auVar657._0_8_ = uVar696;
  auVar698 = auVar657 & auVar703 | auVar691 & local_238;
  auVar231._8_8_ = 0;
  auVar231._0_8_ = local_a8._0_8_ * 2;
  auVar505._8_8_ = 0;
  auVar505._0_8_ = local_98._8_8_;
  auVar232._8_8_ = 0;
  auVar232._0_8_ = local_a8._8_8_ * 2;
  auVar506._8_8_ = 0;
  auVar506._0_8_ = local_98._0_8_;
  auVar233._8_8_ = 0;
  auVar233._0_8_ = local_88;
  auVar507._8_8_ = 0;
  auVar507._0_8_ = local_88;
  uVar670 = SUB168(auVar233 * auVar507,0);
  auVar234._8_8_ = 0;
  auVar234._0_8_ = uVar670 & 0xfffffffffffff;
  auVar3 = auVar232 * auVar506 + auVar231 * auVar505 + auVar234 * ZEXT816(0x1000003d10);
  uVar687 = auVar3._0_8_;
  auVar636._8_8_ = 0;
  auVar636._0_8_ = uVar687 >> 0x34 | auVar3._8_8_ << 0xc;
  uVar683 = local_88 * 2;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = local_a8._0_8_;
  auVar508._8_8_ = 0;
  auVar508._0_8_ = uVar683;
  auVar236._8_8_ = 0;
  auVar236._0_8_ = local_a8._8_8_ * 2;
  auVar509._8_8_ = 0;
  auVar509._0_8_ = local_98._8_8_;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = local_98._0_8_;
  auVar510._8_8_ = 0;
  auVar510._0_8_ = local_98._0_8_;
  auVar238._8_8_ = 0;
  auVar238._0_8_ = uVar670 >> 0x34 | SUB168(auVar233 * auVar507,8) << 0xc;
  auVar3 = auVar235 * auVar508 + auVar636 + auVar236 * auVar509 + auVar237 * auVar510 +
           auVar238 * ZEXT816(0x1000003d10);
  uVar668 = auVar3._0_8_;
  auVar637._8_8_ = 0;
  auVar637._0_8_ = uVar668 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = local_a8._0_8_;
  auVar511._8_8_ = 0;
  auVar511._0_8_ = local_a8._0_8_;
  auVar240._8_8_ = 0;
  auVar240._0_8_ = local_a8._8_8_;
  auVar512._8_8_ = 0;
  auVar512._0_8_ = uVar683;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = local_98._0_8_ * 2;
  auVar513._8_8_ = 0;
  auVar513._0_8_ = local_98._8_8_;
  auVar3 = auVar240 * auVar512 + auVar637 + auVar241 * auVar513;
  uVar670 = auVar3._0_8_;
  auVar639._8_8_ = 0;
  auVar639._0_8_ = uVar670 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar514._8_8_ = 0;
  auVar514._0_8_ = (uVar670 & 0xfffffffffffff) << 4 | (uVar668 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar239 * auVar511 + ZEXT816(0x1000003d1) * auVar514;
  uVar676 = auVar3._0_8_;
  auVar638._8_8_ = 0;
  auVar638._0_8_ = uVar676 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar242._8_8_ = 0;
  auVar242._0_8_ = local_a8._0_8_ * 2;
  auVar515._8_8_ = 0;
  auVar515._0_8_ = local_a8._8_8_;
  auVar243._8_8_ = 0;
  auVar243._0_8_ = local_98._0_8_;
  auVar516._8_8_ = 0;
  auVar516._0_8_ = uVar683;
  auVar244._8_8_ = 0;
  auVar244._0_8_ = local_98._8_8_;
  auVar517._8_8_ = 0;
  auVar517._0_8_ = local_98._8_8_;
  auVar4 = auVar243 * auVar516 + auVar639 + auVar244 * auVar517;
  uVar670 = auVar4._0_8_;
  auVar245._8_8_ = 0;
  auVar245._0_8_ = uVar670 & 0xfffffffffffff;
  auVar3 = auVar242 * auVar515 + auVar638 + auVar245 * ZEXT816(0x1000003d10);
  uVar677 = auVar3._0_8_;
  auVar641._8_8_ = 0;
  auVar641._0_8_ = uVar670 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar640._8_8_ = 0;
  auVar640._0_8_ = uVar677 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar246._8_8_ = 0;
  auVar246._0_8_ = local_a8._0_8_ * 2;
  auVar518._8_8_ = 0;
  auVar518._0_8_ = local_98._0_8_;
  auVar247._8_8_ = 0;
  auVar247._0_8_ = local_a8._8_8_;
  auVar519._8_8_ = 0;
  auVar519._0_8_ = local_a8._8_8_;
  auVar248._8_8_ = 0;
  auVar248._0_8_ = local_98._8_8_;
  auVar520._8_8_ = 0;
  auVar520._0_8_ = uVar683;
  auVar641 = auVar248 * auVar520 + auVar641;
  uVar683 = auVar641._0_8_;
  auVar249._8_8_ = 0;
  auVar249._0_8_ = uVar683 & 0xfffffffffffff;
  auVar3 = auVar246 * auVar518 + auVar640 + auVar247 * auVar519 + auVar249 * ZEXT816(0x1000003d10);
  uVar678 = auVar3._0_8_;
  auVar642._8_8_ = 0;
  auVar642._0_8_ = (uVar678 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar687 & 0xfffffffffffff);
  auVar250._8_8_ = 0;
  auVar250._0_8_ = uVar683 >> 0x34 | auVar641._8_8_ << 0xc;
  auVar642 = auVar250 * ZEXT816(0x1000003d10) + auVar642;
  uVar680 = auVar642._0_8_;
  uVar683 = psVar679->n[0];
  uVar670 = (a->z).n[1];
  uVar687 = (a->z).n[2];
  uVar671 = (a->z).n[3];
  uVar666 = (a->z).n[4];
  auVar251._8_8_ = 0;
  auVar251._0_8_ = local_158;
  auVar521._8_8_ = 0;
  auVar521._0_8_ = uVar671;
  auVar252._8_8_ = 0;
  auVar252._0_8_ = uStack_150;
  auVar522._8_8_ = 0;
  auVar522._0_8_ = uVar687;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = local_148;
  auVar523._8_8_ = 0;
  auVar523._0_8_ = uVar670;
  auVar254._8_8_ = 0;
  auVar254._0_8_ = uStack_140;
  auVar524._8_8_ = 0;
  auVar524._0_8_ = uVar683;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = local_138;
  auVar525._8_8_ = 0;
  auVar525._0_8_ = uVar666;
  uVar673 = SUB168(auVar255 * auVar525,0);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = uVar673 & 0xfffffffffffff;
  auVar3 = auVar252 * auVar522 + auVar251 * auVar521 + auVar253 * auVar523 + auVar254 * auVar524 +
           auVar256 * ZEXT816(0x1000003d10);
  uVar674 = auVar3._0_8_;
  auVar643._8_8_ = 0;
  auVar643._0_8_ = uVar674 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar257._8_8_ = 0;
  auVar257._0_8_ = local_158;
  auVar526._8_8_ = 0;
  auVar526._0_8_ = uVar666;
  auVar258._8_8_ = 0;
  auVar258._0_8_ = uStack_150;
  auVar527._8_8_ = 0;
  auVar527._0_8_ = uVar671;
  auVar259._8_8_ = 0;
  auVar259._0_8_ = local_148;
  auVar528._8_8_ = 0;
  auVar528._0_8_ = uVar687;
  auVar260._8_8_ = 0;
  auVar260._0_8_ = uStack_140;
  auVar529._8_8_ = 0;
  auVar529._0_8_ = uVar670;
  auVar261._8_8_ = 0;
  auVar261._0_8_ = local_138;
  auVar530._8_8_ = 0;
  auVar530._0_8_ = uVar683;
  auVar262._8_8_ = 0;
  auVar262._0_8_ = uVar673 >> 0x34 | SUB168(auVar255 * auVar525,8) << 0xc;
  auVar3 = auVar257 * auVar526 + auVar643 + auVar258 * auVar527 + auVar259 * auVar528 +
           auVar260 * auVar529 + auVar261 * auVar530 + auVar262 * ZEXT816(0x1000003d10);
  uVar673 = auVar3._0_8_;
  auVar644._8_8_ = 0;
  auVar644._0_8_ = uVar673 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = local_158;
  auVar531._8_8_ = 0;
  auVar531._0_8_ = uVar683;
  auVar264._8_8_ = 0;
  auVar264._0_8_ = uStack_150;
  auVar532._8_8_ = 0;
  auVar532._0_8_ = uVar666;
  auVar265._8_8_ = 0;
  auVar265._0_8_ = local_148;
  auVar533._8_8_ = 0;
  auVar533._0_8_ = uVar671;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = uStack_140;
  auVar534._8_8_ = 0;
  auVar534._0_8_ = uVar687;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = local_138;
  auVar535._8_8_ = 0;
  auVar535._0_8_ = uVar670;
  auVar3 = auVar264 * auVar532 + auVar644 + auVar265 * auVar533 + auVar266 * auVar534 +
           auVar267 * auVar535;
  uVar682 = auVar3._0_8_;
  auVar646._8_8_ = 0;
  auVar646._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar536._8_8_ = 0;
  auVar536._0_8_ = (uVar682 & 0xfffffffffffff) << 4 | (uVar673 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar263 * auVar531 + ZEXT816(0x1000003d1) * auVar536;
  uVar682 = auVar3._0_8_;
  (r->z).n[0] = uVar682 & 0xfffffffffffff;
  auVar645._8_8_ = 0;
  auVar645._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = local_158;
  auVar537._8_8_ = 0;
  auVar537._0_8_ = uVar670;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = uStack_150;
  auVar538._8_8_ = 0;
  auVar538._0_8_ = uVar683;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = local_148;
  auVar539._8_8_ = 0;
  auVar539._0_8_ = uVar666;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = uStack_140;
  auVar540._8_8_ = 0;
  auVar540._0_8_ = uVar671;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = local_138;
  auVar541._8_8_ = 0;
  auVar541._0_8_ = uVar687;
  auVar4 = auVar270 * auVar539 + auVar646 + auVar271 * auVar540 + auVar272 * auVar541;
  uVar682 = auVar4._0_8_;
  auVar273._8_8_ = 0;
  auVar273._0_8_ = uVar682 & 0xfffffffffffff;
  auVar3 = auVar268 * auVar537 + auVar645 + auVar269 * auVar538 + auVar273 * ZEXT816(0x1000003d10);
  uVar681 = auVar3._0_8_;
  auVar648._8_8_ = 0;
  auVar648._0_8_ = uVar682 >> 0x34 | auVar4._8_8_ << 0xc;
  (r->z).n[1] = uVar681 & 0xfffffffffffff;
  auVar647._8_8_ = 0;
  auVar647._0_8_ = uVar681 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar274._8_8_ = 0;
  auVar274._0_8_ = local_158;
  auVar542._8_8_ = 0;
  auVar542._0_8_ = uVar687;
  auVar275._8_8_ = 0;
  auVar275._0_8_ = uStack_150;
  auVar543._8_8_ = 0;
  auVar543._0_8_ = uVar670;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = local_148;
  auVar544._8_8_ = 0;
  auVar544._0_8_ = uVar683;
  auVar277._8_8_ = 0;
  auVar277._0_8_ = uStack_140;
  auVar545._8_8_ = 0;
  auVar545._0_8_ = uVar666;
  auVar278._8_8_ = 0;
  auVar278._0_8_ = local_138;
  auVar546._8_8_ = 0;
  auVar546._0_8_ = uVar671;
  auVar4 = auVar277 * auVar545 + auVar648 + auVar278 * auVar546;
  uVar683 = auVar4._0_8_;
  auVar279._8_8_ = 0;
  auVar279._0_8_ = uVar683 & 0xfffffffffffff;
  auVar3 = auVar274 * auVar542 + auVar647 + auVar275 * auVar543 + auVar276 * auVar544 +
           auVar279 * ZEXT816(0x1000003d10);
  uVar670 = auVar3._0_8_;
  (r->z).n[2] = uVar670 & 0xfffffffffffff;
  auVar649._8_8_ = 0;
  auVar649._0_8_ = (uVar670 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar674 & 0xfffffffffffff);
  auVar280._8_8_ = 0;
  auVar280._0_8_ = uVar683 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar649 = auVar280 * ZEXT816(0x1000003d10) + auVar649;
  uVar683 = auVar649._0_8_;
  (r->z).n[3] = uVar683 & 0xfffffffffffff;
  (r->z).n[4] = (uVar683 >> 0x34 | auVar649._8_8_ << 0xc) + (uVar673 & 0xffffffffffff);
  iVar665 = secp256k1_fe_normalizes_to_zero(&r->z);
  iVar2 = a->infinity;
  uVar688 = (r->z).n[1];
  uVar693 = (r->z).n[2];
  uVar697 = (r->z).n[3];
  (r->z).n[0] = (r->z).n[0] * 2;
  (r->z).n[1] = uVar688 * 2;
  (r->z).n[2] = uVar693 * 2;
  (r->z).n[3] = uVar697 * 2;
  puVar1 = (r->z).n + 4;
  *puVar1 = *puVar1 << 1;
  local_100 = 0x3ffffbfffff0bc - local_100;
  local_f8 = 0x3ffffffffffffc - local_f8;
  local_f0 = 0x3ffffffffffffc - local_f0;
  local_e8 = 0x3ffffffffffffc - local_e8;
  local_e0 = 0x3fffffffffffc - local_e0;
  uVar687 = (uVar680 >> 0x34 | auVar642._8_8_ << 0xc) + (uVar668 & 0xffffffffffff) + local_e0;
  uVar683 = (uVar687 >> 0x30) * 0x1000003d1 + (uVar676 & 0xfffffffffffff) + local_100;
  uVar670 = (uVar683 >> 0x34) + (uVar677 & 0xfffffffffffff) + local_f8;
  uVar671 = (uVar670 >> 0x34) + (uVar678 & 0xfffffffffffff) + local_f0;
  uVar666 = (uVar671 >> 0x34) + (uVar680 & 0xfffffffffffff) + local_e8;
  uVar688 = (uVar666 >> 0x34) + (uVar687 & 0xffffffffffff);
  uVar683 = uVar683 & 0xfffffffffffff;
  uVar670 = uVar670 & 0xfffffffffffff;
  uVar671 = uVar671 & 0xfffffffffffff;
  uVar666 = uVar666 & 0xfffffffffffff;
  (r->x).n[4] = uVar688;
  (r->x).n[2] = uVar671;
  (r->x).n[3] = uVar666;
  (r->x).n[0] = uVar683;
  (r->x).n[1] = uVar670;
  uVar683 = local_100 + uVar683 * 2;
  uVar670 = local_f8 + uVar670 * 2;
  uVar687 = local_f0 + uVar671 * 2;
  uVar671 = local_e8 + uVar666 * 2;
  uVar666 = local_e0 + uVar688 * 2;
  auVar281._8_8_ = 0;
  auVar281._0_8_ = local_a8._0_8_;
  auVar547._8_8_ = 0;
  auVar547._0_8_ = uVar671;
  auVar282._8_8_ = 0;
  auVar282._0_8_ = local_a8._8_8_;
  auVar548._8_8_ = 0;
  auVar548._0_8_ = uVar687;
  auVar283._8_8_ = 0;
  auVar283._0_8_ = local_98._0_8_;
  auVar549._8_8_ = 0;
  auVar549._0_8_ = uVar670;
  auVar284._8_8_ = 0;
  auVar284._0_8_ = local_98._8_8_;
  auVar550._8_8_ = 0;
  auVar550._0_8_ = uVar683;
  auVar285._8_8_ = 0;
  auVar285._0_8_ = local_88;
  auVar551._8_8_ = 0;
  auVar551._0_8_ = uVar666;
  uVar673 = SUB168(auVar285 * auVar551,0);
  auVar286._8_8_ = 0;
  auVar286._0_8_ = uVar673 & 0xfffffffffffff;
  auVar3 = auVar282 * auVar548 + auVar281 * auVar547 + auVar283 * auVar549 + auVar284 * auVar550 +
           auVar286 * ZEXT816(0x1000003d10);
  uVar674 = auVar3._0_8_;
  auVar650._8_8_ = 0;
  auVar650._0_8_ = uVar674 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar287._8_8_ = 0;
  auVar287._0_8_ = local_a8._0_8_;
  auVar552._8_8_ = 0;
  auVar552._0_8_ = uVar666;
  auVar288._8_8_ = 0;
  auVar288._0_8_ = local_a8._8_8_;
  auVar553._8_8_ = 0;
  auVar553._0_8_ = uVar671;
  auVar289._8_8_ = 0;
  auVar289._0_8_ = local_98._0_8_;
  auVar554._8_8_ = 0;
  auVar554._0_8_ = uVar687;
  auVar290._8_8_ = 0;
  auVar290._0_8_ = local_98._8_8_;
  auVar555._8_8_ = 0;
  auVar555._0_8_ = uVar670;
  auVar291._8_8_ = 0;
  auVar291._0_8_ = local_88;
  auVar556._8_8_ = 0;
  auVar556._0_8_ = uVar683;
  auVar292._8_8_ = 0;
  auVar292._0_8_ = uVar673 >> 0x34 | SUB168(auVar285 * auVar551,8) << 0xc;
  auVar3 = auVar287 * auVar552 + auVar650 + auVar288 * auVar553 + auVar289 * auVar554 +
           auVar290 * auVar555 + auVar291 * auVar556 + auVar292 * ZEXT816(0x1000003d10);
  uVar673 = auVar3._0_8_;
  auVar651._8_8_ = 0;
  auVar651._0_8_ = uVar673 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar293._8_8_ = 0;
  auVar293._0_8_ = local_a8._0_8_;
  auVar557._8_8_ = 0;
  auVar557._0_8_ = uVar683;
  auVar294._8_8_ = 0;
  auVar294._0_8_ = local_a8._8_8_;
  auVar558._8_8_ = 0;
  auVar558._0_8_ = uVar666;
  auVar295._8_8_ = 0;
  auVar295._0_8_ = local_98._0_8_;
  auVar559._8_8_ = 0;
  auVar559._0_8_ = uVar671;
  auVar296._8_8_ = 0;
  auVar296._0_8_ = local_98._8_8_;
  auVar560._8_8_ = 0;
  auVar560._0_8_ = uVar687;
  auVar297._8_8_ = 0;
  auVar297._0_8_ = local_88;
  auVar561._8_8_ = 0;
  auVar561._0_8_ = uVar670;
  auVar3 = auVar294 * auVar558 + auVar651 + auVar295 * auVar559 + auVar296 * auVar560 +
           auVar297 * auVar561;
  uVar682 = auVar3._0_8_;
  auVar653._8_8_ = 0;
  auVar653._0_8_ = uVar682 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar562._8_8_ = 0;
  auVar562._0_8_ = (uVar682 & 0xfffffffffffff) << 4 | (uVar673 & 0xfffffffffffff) >> 0x30;
  auVar3 = auVar293 * auVar557 + ZEXT816(0x1000003d1) * auVar562;
  uVar668 = auVar3._0_8_;
  auVar652._8_8_ = 0;
  auVar652._0_8_ = uVar668 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar298._8_8_ = 0;
  auVar298._0_8_ = local_a8._0_8_;
  auVar563._8_8_ = 0;
  auVar563._0_8_ = uVar670;
  auVar299._8_8_ = 0;
  auVar299._0_8_ = local_a8._8_8_;
  auVar564._8_8_ = 0;
  auVar564._0_8_ = uVar683;
  auVar300._8_8_ = 0;
  auVar300._0_8_ = local_98._0_8_;
  auVar565._8_8_ = 0;
  auVar565._0_8_ = uVar666;
  auVar301._8_8_ = 0;
  auVar301._0_8_ = local_98._8_8_;
  auVar566._8_8_ = 0;
  auVar566._0_8_ = uVar671;
  auVar302._8_8_ = 0;
  auVar302._0_8_ = local_88;
  auVar567._8_8_ = 0;
  auVar567._0_8_ = uVar687;
  auVar4 = auVar300 * auVar565 + auVar653 + auVar301 * auVar566 + auVar302 * auVar567;
  uVar682 = auVar4._0_8_;
  auVar303._8_8_ = 0;
  auVar303._0_8_ = uVar682 & 0xfffffffffffff;
  auVar3 = auVar298 * auVar563 + auVar652 + auVar299 * auVar564 + auVar303 * ZEXT816(0x1000003d10);
  uVar676 = auVar3._0_8_;
  auVar655._8_8_ = 0;
  auVar655._0_8_ = uVar682 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar654._8_8_ = 0;
  auVar654._0_8_ = uVar676 >> 0x34 | auVar3._8_8_ << 0xc;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = local_a8._0_8_;
  auVar568._8_8_ = 0;
  auVar568._0_8_ = uVar687;
  auVar305._8_8_ = 0;
  auVar305._0_8_ = local_a8._8_8_;
  auVar569._8_8_ = 0;
  auVar569._0_8_ = uVar670;
  auVar306._8_8_ = 0;
  auVar306._0_8_ = local_98._0_8_;
  auVar570._8_8_ = 0;
  auVar570._0_8_ = uVar683;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = local_98._8_8_;
  auVar571._8_8_ = 0;
  auVar571._0_8_ = uVar666;
  auVar308._8_8_ = 0;
  auVar308._0_8_ = local_88;
  auVar572._8_8_ = 0;
  auVar572._0_8_ = uVar671;
  auVar4 = auVar307 * auVar571 + auVar655 + auVar308 * auVar572;
  uVar683 = auVar4._0_8_;
  auVar309._8_8_ = 0;
  auVar309._0_8_ = uVar683 & 0xfffffffffffff;
  auVar3 = auVar304 * auVar568 + auVar654 + auVar305 * auVar569 + auVar306 * auVar570 +
           auVar309 * ZEXT816(0x1000003d10);
  uVar670 = auVar3._0_8_;
  auVar656._8_8_ = 0;
  auVar656._0_8_ = (uVar670 >> 0x34 | auVar3._8_8_ << 0xc) + (uVar674 & 0xfffffffffffff);
  auVar310._8_8_ = 0;
  auVar310._0_8_ = uVar683 >> 0x34 | auVar4._8_8_ << 0xc;
  auVar656 = auVar310 * ZEXT816(0x1000003d10) + auVar656;
  uVar683 = auVar656._0_8_;
  local_248._0_8_ = auVar705._0_8_;
  local_248._8_8_ = auVar705._8_8_;
  (r->y).n[0] = 0x7ffff7ffffe178 - ((uVar668 & 0xfffffffffffff) + local_248._0_8_);
  (r->y).n[1] = 0x7ffffffffffff8 - ((uVar676 & 0xfffffffffffff) + local_248._8_8_);
  local_238._0_8_ = auVar698._0_8_;
  local_238._8_8_ = auVar698._8_8_;
  (r->y).n[2] = 0x7ffffffffffff8 - ((uVar670 & 0xfffffffffffff) + local_238._0_8_);
  (r->y).n[3] = 0x7ffffffffffff8 - ((uVar683 & 0xfffffffffffff) + local_238._8_8_);
  (r->y).n[4] = 0x7fffffffffff8 -
                ((uVar683 >> 0x34 | auVar656._8_8_ << 0xc) + (uVar673 & 0xffffffffffff) +
                (uVar669 & uVar686 |
                uVar675 & (uVar672 >> 0x34 | auVar635._8_8_ << 0xc) + (uVar685 & 0xffffffffffff)));
  secp256k1_fe_normalize_weak(&r->y);
  uVar688 = (r->x).n[1];
  uVar669 = (r->x).n[0] << 2;
  (r->x).n[0] = uVar669;
  uVar668 = uVar688 << 2;
  (r->x).n[1] = uVar668;
  uVar670 = (r->x).n[2] << 2;
  (r->x).n[2] = uVar670;
  uVar685 = (r->x).n[3] << 2;
  (r->x).n[3] = uVar685;
  uVar682 = (r->x).n[4] << 2;
  (r->x).n[4] = uVar682;
  uVar674 = (r->y).n[0] << 2;
  (r->y).n[0] = uVar674;
  uVar673 = (r->y).n[1] << 2;
  (r->y).n[1] = uVar673;
  uVar666 = (r->y).n[2] << 2;
  (r->y).n[2] = uVar666;
  uVar671 = (r->y).n[3] << 2;
  (r->y).n[3] = uVar671;
  uVar687 = (r->y).n[4] << 2;
  (r->y).n[4] = uVar687;
  uVar675 = (long)a->infinity - 1;
  uVar683 = -(long)a->infinity;
  (r->x).n[0] = (b->x).n[0] & uVar683 | uVar669 & uVar675;
  (r->x).n[1] = (b->x).n[1] & uVar683 | uVar668 & uVar675;
  (r->x).n[2] = (b->x).n[2] & uVar683 | uVar670 & uVar675;
  (r->x).n[3] = (b->x).n[3] & uVar683 | uVar685 & uVar675;
  (r->x).n[4] = (b->x).n[4] & uVar683 | uVar682 & uVar675;
  (r->y).n[0] = (b->y).n[0] & uVar683 | uVar674 & uVar675;
  (r->y).n[1] = (b->y).n[1] & uVar683 | uVar673 & uVar675;
  (r->y).n[2] = (b->y).n[2] & uVar683 | uVar666 & uVar675;
  (r->y).n[3] = (b->y).n[3] & uVar683 | uVar671 & uVar675;
  (r->y).n[4] = (b->y).n[4] & uVar683 | uVar687 & uVar675;
  (r->z).n[0] = (ulong)((uint)uVar683 & 1) | uVar675 & (r->z).n[0];
  auVar692._8_4_ = (int)uVar675;
  auVar692._0_8_ = uVar675;
  auVar692._12_4_ = (int)(uVar675 >> 0x20);
  *(undefined1 (*) [16])((r->z).n + 1) = *(undefined1 (*) [16])((r->z).n + 1) & auVar692;
  *(undefined1 (*) [16])((r->z).n + 3) = *(undefined1 (*) [16])((r->z).n + 3) & auVar692;
  r->infinity = (1 - iVar2) * iVar665;
  return;
}

Assistant:

static void secp256k1_gej_add_ge(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b) {
    /* Operations: 7 mul, 5 sqr, 4 normalize, 21 mul_int/add/negate/cmov */
    static const secp256k1_fe fe_1 = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0, 1);
    secp256k1_fe zz, u1, u2, s1, s2, t, tt, m, n, q, rr;
    secp256k1_fe m_alt, rr_alt;
    int infinity, degenerate;
    VERIFY_CHECK(!b->infinity);
    VERIFY_CHECK(a->infinity == 0 || a->infinity == 1);

    /** In:
     *    Eric Brier and Marc Joye, Weierstrass Elliptic Curves and Side-Channel Attacks.
     *    In D. Naccache and P. Paillier, Eds., Public Key Cryptography, vol. 2274 of Lecture Notes in Computer Science, pages 335-345. Springer-Verlag, 2002.
     *  we find as solution for a unified addition/doubling formula:
     *    lambda = ((x1 + x2)^2 - x1 * x2 + a) / (y1 + y2), with a = 0 for secp256k1's curve equation.
     *    x3 = lambda^2 - (x1 + x2)
     *    2*y3 = lambda * (x1 + x2 - 2 * x3) - (y1 + y2).
     *
     *  Substituting x_i = Xi / Zi^2 and yi = Yi / Zi^3, for i=1,2,3, gives:
     *    U1 = X1*Z2^2, U2 = X2*Z1^2
     *    S1 = Y1*Z2^3, S2 = Y2*Z1^3
     *    Z = Z1*Z2
     *    T = U1+U2
     *    M = S1+S2
     *    Q = T*M^2
     *    R = T^2-U1*U2
     *    X3 = 4*(R^2-Q)
     *    Y3 = 4*(R*(3*Q-2*R^2)-M^4)
     *    Z3 = 2*M*Z
     *  (Note that the paper uses xi = Xi / Zi and yi = Yi / Zi instead.)
     *
     *  This formula has the benefit of being the same for both addition
     *  of distinct points and doubling. However, it breaks down in the
     *  case that either point is infinity, or that y1 = -y2. We handle
     *  these cases in the following ways:
     *
     *    - If b is infinity we simply bail by means of a VERIFY_CHECK.
     *
     *    - If a is infinity, we detect this, and at the end of the
     *      computation replace the result (which will be meaningless,
     *      but we compute to be constant-time) with b.x : b.y : 1.
     *
     *    - If a = -b, we have y1 = -y2, which is a degenerate case.
     *      But here the answer is infinity, so we simply set the
     *      infinity flag of the result, overriding the computed values
     *      without even needing to cmov.
     *
     *    - If y1 = -y2 but x1 != x2, which does occur thanks to certain
     *      properties of our curve (specifically, 1 has nontrivial cube
     *      roots in our field, and the curve equation has no x coefficient)
     *      then the answer is not infinity but also not given by the above
     *      equation. In this case, we cmov in place an alternate expression
     *      for lambda. Specifically (y1 - y2)/(x1 - x2). Where both these
     *      expressions for lambda are defined, they are equal, and can be
     *      obtained from each other by multiplication by (y1 + y2)/(y1 + y2)
     *      then substitution of x^3 + 7 for y^2 (using the curve equation).
     *      For all pairs of nonzero points (a, b) at least one is defined,
     *      so this covers everything.
     */

    secp256k1_fe_sqr(&zz, &a->z);                       /* z = Z1^2 */
    u1 = a->x; secp256k1_fe_normalize_weak(&u1);        /* u1 = U1 = X1*Z2^2 (1) */
    secp256k1_fe_mul(&u2, &b->x, &zz);                  /* u2 = U2 = X2*Z1^2 (1) */
    s1 = a->y; secp256k1_fe_normalize_weak(&s1);        /* s1 = S1 = Y1*Z2^3 (1) */
    secp256k1_fe_mul(&s2, &b->y, &zz);                  /* s2 = Y2*Z1^2 (1) */
    secp256k1_fe_mul(&s2, &s2, &a->z);                  /* s2 = S2 = Y2*Z1^3 (1) */
    t = u1; secp256k1_fe_add(&t, &u2);                  /* t = T = U1+U2 (2) */
    m = s1; secp256k1_fe_add(&m, &s2);                  /* m = M = S1+S2 (2) */
    secp256k1_fe_sqr(&rr, &t);                          /* rr = T^2 (1) */
    secp256k1_fe_negate(&m_alt, &u2, 1);                /* Malt = -X2*Z1^2 */
    secp256k1_fe_mul(&tt, &u1, &m_alt);                 /* tt = -U1*U2 (2) */
    secp256k1_fe_add(&rr, &tt);                         /* rr = R = T^2-U1*U2 (3) */
    /** If lambda = R/M = 0/0 we have a problem (except in the "trivial"
     *  case that Z = z1z2 = 0, and this is special-cased later on). */
    degenerate = secp256k1_fe_normalizes_to_zero(&m) &
                 secp256k1_fe_normalizes_to_zero(&rr);
    /* This only occurs when y1 == -y2 and x1^3 == x2^3, but x1 != x2.
     * This means either x1 == beta*x2 or beta*x1 == x2, where beta is
     * a nontrivial cube root of one. In either case, an alternate
     * non-indeterminate expression for lambda is (y1 - y2)/(x1 - x2),
     * so we set R/M equal to this. */
    rr_alt = s1;
    secp256k1_fe_mul_int(&rr_alt, 2);       /* rr = Y1*Z2^3 - Y2*Z1^3 (2) */
    secp256k1_fe_add(&m_alt, &u1);          /* Malt = X1*Z2^2 - X2*Z1^2 */

    secp256k1_fe_cmov(&rr_alt, &rr, !degenerate);
    secp256k1_fe_cmov(&m_alt, &m, !degenerate);
    /* Now Ralt / Malt = lambda and is guaranteed not to be 0/0.
     * From here on out Ralt and Malt represent the numerator
     * and denominator of lambda; R and M represent the explicit
     * expressions x1^2 + x2^2 + x1x2 and y1 + y2. */
    secp256k1_fe_sqr(&n, &m_alt);                       /* n = Malt^2 (1) */
    secp256k1_fe_mul(&q, &n, &t);                       /* q = Q = T*Malt^2 (1) */
    /* These two lines use the observation that either M == Malt or M == 0,
     * so M^3 * Malt is either Malt^4 (which is computed by squaring), or
     * zero (which is "computed" by cmov). So the cost is one squaring
     * versus two multiplications. */
    secp256k1_fe_sqr(&n, &n);
    secp256k1_fe_cmov(&n, &m, degenerate);              /* n = M^3 * Malt (2) */
    secp256k1_fe_sqr(&t, &rr_alt);                      /* t = Ralt^2 (1) */
    secp256k1_fe_mul(&r->z, &a->z, &m_alt);             /* r->z = Malt*Z (1) */
    infinity = secp256k1_fe_normalizes_to_zero(&r->z) * (1 - a->infinity);
    secp256k1_fe_mul_int(&r->z, 2);                     /* r->z = Z3 = 2*Malt*Z (2) */
    secp256k1_fe_negate(&q, &q, 1);                     /* q = -Q (2) */
    secp256k1_fe_add(&t, &q);                           /* t = Ralt^2-Q (3) */
    secp256k1_fe_normalize_weak(&t);
    r->x = t;                                           /* r->x = Ralt^2-Q (1) */
    secp256k1_fe_mul_int(&t, 2);                        /* t = 2*x3 (2) */
    secp256k1_fe_add(&t, &q);                           /* t = 2*x3 - Q: (4) */
    secp256k1_fe_mul(&t, &t, &rr_alt);                  /* t = Ralt*(2*x3 - Q) (1) */
    secp256k1_fe_add(&t, &n);                           /* t = Ralt*(2*x3 - Q) + M^3*Malt (3) */
    secp256k1_fe_negate(&r->y, &t, 3);                  /* r->y = Ralt*(Q - 2x3) - M^3*Malt (4) */
    secp256k1_fe_normalize_weak(&r->y);
    secp256k1_fe_mul_int(&r->x, 4);                     /* r->x = X3 = 4*(Ralt^2-Q) */
    secp256k1_fe_mul_int(&r->y, 4);                     /* r->y = Y3 = 4*Ralt*(Q - 2x3) - 4*M^3*Malt (4) */

    /** In case a->infinity == 1, replace r with (b->x, b->y, 1). */
    secp256k1_fe_cmov(&r->x, &b->x, a->infinity);
    secp256k1_fe_cmov(&r->y, &b->y, a->infinity);
    secp256k1_fe_cmov(&r->z, &fe_1, a->infinity);
    r->infinity = infinity;
}